

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseBlockDeclaration(WastParser *this,BlockDeclaration *decl)

{
  Result RVar1;
  Enum EVar2;
  FuncDeclaration func_decl;
  
  FuncDeclaration::FuncDeclaration(&func_decl);
  RVar1 = ParseTypeUseOpt(this,&func_decl);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUnboundFuncSignature(this,&func_decl.sig);
    if (RVar1.enum_ != Error) {
      decl->has_func_type = func_decl.has_func_type;
      Var::operator=(&decl->type_var,&func_decl.type_var);
      FuncSignature::operator=(&decl->sig,&func_decl.sig);
      EVar2 = Ok;
    }
  }
  FuncDeclaration::~FuncDeclaration(&func_decl);
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseBlockDeclaration(BlockDeclaration* decl) {
  WABT_TRACE(ParseBlockDeclaration);
  FuncDeclaration func_decl;
  CHECK_RESULT(ParseTypeUseOpt(&func_decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&func_decl.sig));
  decl->has_func_type = func_decl.has_func_type;
  decl->type_var = func_decl.type_var;
  decl->sig = func_decl.sig;
  return Result::Ok;
}